

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_SimpleString_Concatenation_TestShell::createTest
          (TEST_SimpleString_Concatenation_TestShell *this)

{
  TEST_SimpleString_Concatenation_Test *this_00;
  
  this_00 = (TEST_SimpleString_Concatenation_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x13c);
  TEST_SimpleString_Concatenation_Test::TEST_SimpleString_Concatenation_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, Concatenation)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 += s1;
    s4 += s2;

    CHECK_EQUAL(s3, s4);

    SimpleString s5("hello!goodbye!hello!goodbye!");
    s4 += s4;

    CHECK_EQUAL(s5, s4);
}